

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Prepare16(sqlite3 *db,void *zSql,int nBytes,u32 prepFlags,sqlite3_stmt **ppStmt,
                    void **pzTail)

{
  int iVar1;
  int rc;
  char *zSql_00;
  u8 enc;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  int sz;
  ulong uVar6;
  long in_FS_OFFSET;
  char *zTail8;
  char *local_40;
  long local_38;
  
  enc = (u8)prepFlags;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (char *)0x0;
  *ppStmt = (sqlite3_stmt *)0x0;
  iVar1 = sqlite3SafetyCheckOk(db);
  if ((zSql == (void *)0x0) || (iVar1 == 0)) {
    iVar1 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x2318d,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    goto LAB_00129ada;
  }
  if (nBytes < 0) {
    for (uVar6 = 0;
        (*(char *)((long)zSql + uVar6) != '\0' || (*(char *)((long)zSql + uVar6 + 1) != '\0'));
        uVar6 = uVar6 + 2) {
    }
  }
  else if (nBytes == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      if ((*(char *)((long)zSql + uVar6) == '\0') && (*(char *)((long)zSql + uVar6 + 1) == '\0'))
      break;
      uVar6 = uVar6 + 2;
    } while ((int)uVar6 < nBytes);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  zSql_00 = sqlite3Utf16to8(db,zSql,(int)uVar6,enc);
  rc = 0;
  if (zSql_00 != (char *)0x0) {
    rc = sqlite3LockAndPrepare(db,zSql_00,-1,prepFlags,(Vdbe *)0x0,ppStmt,&local_40);
    if (pzTail != (void **)0x0 && local_40 != (char *)0x0) {
      iVar1 = sqlite3Utf8CharLen(zSql_00,(int)local_40 - (int)zSql_00);
      pbVar4 = (byte *)((long)zSql + ((uVar6 & 0xffffffff) - 1));
      pbVar2 = (byte *)((long)zSql + 1);
      if (pbVar4 < pbVar2 || iVar1 < 1) {
        *pzTail = (void *)((long)(int)((int)pbVar2 + ~(uint)zSql) + (long)zSql);
      }
      else {
        iVar5 = 1;
        do {
          pbVar3 = pbVar2 + 2;
          if ((((*pbVar2 & 0xfc) == 0xd8) && (pbVar3 <= pbVar4)) && ((pbVar2[2] & 0xfc) == 0xdc)) {
            pbVar3 = pbVar2 + 4;
          }
        } while ((iVar5 < iVar1) && (iVar5 = iVar5 + 1, pbVar2 = pbVar3, pbVar3 <= pbVar4));
        *pzTail = (void *)((long)(int)((int)pbVar3 + ~(uint)zSql) + (long)zSql);
        if (zSql_00 == (char *)0x0) goto LAB_00129ab7;
      }
    }
    sqlite3DbFreeNN(db,zSql_00);
  }
LAB_00129ab7:
  iVar1 = 0;
  if ((rc != 0) || (db->mallocFailed != '\0')) {
    iVar1 = apiHandleError(db,rc);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
LAB_00129ada:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

static int sqlite3Prepare16(
  sqlite3 *db,              /* Database handle. */
  const void *zSql,         /* UTF-16 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const void **pzTail       /* OUT: End of parsed string */
){
  /* This function currently works by first transforming the UTF-16
  ** encoded string to UTF-8, then invoking sqlite3_prepare(). The
  ** tricky bit is figuring out the pointer to return in *pzTail.
  */
  char *zSql8;
  const char *zTail8 = 0;
  int rc = SQLITE_OK;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }

  /* Make sure nBytes is non-negative and correct.  It should be the
  ** number of bytes until the end of the input buffer or until the first
  ** U+0000 character.  If the input nBytes is odd, convert it into
  ** an even number.  If the input nBytes is negative, then the input
  ** must be terminated by at least one U+0000 character */
  if( nBytes>=0 ){
    int sz;
    const char *z = (const char*)zSql;
    for(sz=0; sz<nBytes && (z[sz]!=0 || z[sz+1]!=0); sz += 2){}
    nBytes = sz;
  }else{
    int sz;
    const char *z = (const char*)zSql;
    for(sz=0; z[sz]!=0 || z[sz+1]!=0; sz += 2){}
    nBytes = sz;
  }

  sqlite3_mutex_enter(db->mutex);
  zSql8 = sqlite3Utf16to8(db, zSql, nBytes, SQLITE_UTF16NATIVE);
  if( zSql8 ){
    rc = sqlite3LockAndPrepare(db, zSql8, -1, prepFlags, 0, ppStmt, &zTail8);
  }

  if( zTail8 && pzTail ){
    /* If sqlite3_prepare returns a tail pointer, we calculate the
    ** equivalent pointer into the UTF-16 string by counting the unicode
    ** characters between zSql8 and zTail8, and then returning a pointer
    ** the same number of characters into the UTF-16 string.
    */
    int chars_parsed = sqlite3Utf8CharLen(zSql8, (int)(zTail8-zSql8));
    *pzTail = (u8 *)zSql + sqlite3Utf16ByteLen(zSql, nBytes, chars_parsed);
  }
  sqlite3DbFree(db, zSql8);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}